

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
anon_unknown.dwarf_6d9132::TargetSourcesImpl::ConvertToAbsoluteContent
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,TargetSourcesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,IsInterface isInterfaceContent,CheckCMP0076 checkCmp0076)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  PolicyStatus PVar4;
  size_type __n;
  size_type sVar5;
  cmMakefile *pcVar6;
  string *__rhs;
  ostream *poVar7;
  string *psVar8;
  PolicyID id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_358;
  string local_2a8;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  ostringstream e;
  bool useAbsoluteContent;
  bool issueMessage;
  string local_c0;
  undefined1 local_a0 [8];
  string absoluteSrc;
  string *src;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absoluteContent;
  bool changedPath;
  CheckCMP0076 checkCmp0076_local;
  IsInterface isInterfaceContent_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  TargetSourcesImpl *this_local;
  
  if ((checkCmp0076 == Yes) &&
     (PVar4 = cmMakefile::GetPolicyStatus
                        ((this->super_cmTargetPropCommandBase).Makefile,CMP0076,false), PVar4 == OLD
     )) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
  }
  else {
    absoluteContent.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50);
    __n = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(content);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,__n);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(content);
    src = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(content);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&src), bVar2) {
      absoluteSrc.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      std::__cxx11::string::string((string *)local_a0);
      bVar2 = cmsys::SystemTools::FileIsFullPath((string *)absoluteSrc.field_2._8_8_);
      if ((bVar2) || (sVar5 = cmGeneratorExpression::Find(absoluteSrc.field_2._8_8_), sVar5 == 0)) {
LAB_003fd8f8:
        std::__cxx11::string::operator=((string *)local_a0,(string *)absoluteSrc.field_2._8_8_);
      }
      else {
        if (isInterfaceContent == No) {
          psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                             ((this->super_cmTargetPropCommandBase).Makefile);
          pcVar6 = cmTarget::GetMakefile(tgt);
          __rhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar6);
          _Var3 = std::operator==(psVar8,__rhs);
          if (_Var3) goto LAB_003fd8f8;
        }
        absoluteContent.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((this->super_cmTargetPropCommandBase).Makefile);
        issueMessage = true;
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                  (&local_c0,psVar8,&issueMessage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   absoluteSrc.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,(value_type *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    if ((absoluteContent.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__,content);
    }
    else {
      bVar2 = true;
      bVar1 = false;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
      if (checkCmp0076 == Yes) {
        PVar4 = cmMakefile::GetPolicyStatus
                          ((this->super_cmTargetPropCommandBase).Makefile,CMP0076,false);
        switch(PVar4) {
        case OLD:
          bVar2 = false;
          break;
        case WARN:
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_268,(cmPolicies *)0x4c,id);
          poVar7 = std::operator<<((ostream *)local_248,(string *)&local_268);
          std::operator<<(poVar7,"\n");
          std::__cxx11::string::~string((string *)&local_268);
          break;
        case NEW:
          bVar2 = false;
          bVar1 = true;
          break;
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          pcVar6 = (this->super_cmTargetPropCommandBase).Makefile;
          cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_288,(cmPolicies *)0x4c,id);
          cmMakefile::IssueMessage(pcVar6,FATAL_ERROR,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
        }
      }
      else {
        bVar2 = false;
        bVar1 = true;
      }
      if (bVar2) {
        if (isInterfaceContent == Yes) {
          poVar7 = std::operator<<((ostream *)local_248,"An interface source of target \"");
          psVar8 = cmTarget::GetName_abi_cxx11_(tgt);
          poVar7 = std::operator<<(poVar7,(string *)psVar8);
          std::operator<<(poVar7,"\" has a relative path.");
        }
        else {
          poVar7 = std::operator<<((ostream *)local_248,
                                   "A private source from a directory other than that of target \"")
          ;
          psVar8 = cmTarget::GetName_abi_cxx11_(tgt);
          poVar7 = std::operator<<(poVar7,(string *)psVar8);
          std::operator<<(poVar7,"\" has a relative path.");
        }
        pcVar6 = (this->super_cmTargetPropCommandBase).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
      }
      local_358 = content;
      if (bVar1) {
        local_358 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_50;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__,local_358);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> TargetSourcesImpl::ConvertToAbsoluteContent(
  cmTarget* tgt, const std::vector<std::string>& content,
  IsInterface isInterfaceContent, CheckCMP0076 checkCmp0076)
{
  // Skip conversion in case old behavior has been explicitly requested
  if (checkCmp0076 == CheckCMP0076::Yes &&
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0076) ==
        cmPolicies::OLD) {
    return content;
  }

  bool changedPath = false;
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    if (cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0 ||
        (isInterfaceContent == IsInterface::No &&
         (this->Makefile->GetCurrentSourceDirectory() ==
          tgt->GetMakefile()->GetCurrentSourceDirectory()))) {
      absoluteSrc = src;
    } else {
      changedPath = true;
      absoluteSrc =
        cmStrCat(this->Makefile->GetCurrentSourceDirectory(), '/', src);
    }
    absoluteContent.push_back(absoluteSrc);
  }

  if (!changedPath) {
    return content;
  }

  bool issueMessage = true;
  bool useAbsoluteContent = false;
  std::ostringstream e;
  if (checkCmp0076 == CheckCMP0076::Yes) {
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0076) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0076));
        break;
      case cmPolicies::NEW: {
        issueMessage = false;
        useAbsoluteContent = true;
        break;
      }
    }
  } else {
    issueMessage = false;
    useAbsoluteContent = true;
  }

  if (issueMessage) {
    if (isInterfaceContent == IsInterface::Yes) {
      e << "An interface source of target \"" << tgt->GetName()
        << "\" has a relative path.";
    } else {
      e << "A private source from a directory other than that of target \""
        << tgt->GetName() << "\" has a relative path.";
    }
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
  }

  return useAbsoluteContent ? absoluteContent : content;
}